

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O3

Reals __thiscall
Omega_h::diffuse_densities_once
          (Omega_h *this,Mesh *mesh,Graph *g,Reals *densities,Reals *cell_sizes)

{
  int *piVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  Alloc *pAVar10;
  Mesh *this_00;
  Alloc *pAVar11;
  LO LVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  Reals RVar20;
  Write<double> out;
  type f;
  Alloc *local_1a0;
  void *local_198;
  Alloc *local_190;
  Alloc *local_188;
  Alloc *local_180;
  Read<signed_char> local_178;
  Write<double> local_168;
  string local_158;
  Alloc *local_138;
  void *local_130;
  int local_128;
  Alloc *local_120;
  void *local_118;
  Alloc *local_110;
  void *local_108;
  Mesh *local_100;
  Read<signed_char> local_f8;
  Alloc *local_e8;
  void *pvStack_e0;
  Alloc *local_d8;
  void *pvStack_d0;
  Alloc *local_c8;
  void *pvStack_c0;
  int local_b8;
  Alloc *local_b0;
  void *pvStack_a8;
  Alloc *local_a0;
  void *pvStack_98;
  Alloc *local_88;
  void *local_80;
  Alloc *local_78;
  void *local_70;
  Alloc *local_68;
  void *local_60;
  int local_58;
  Alloc *local_50;
  void *local_48;
  Alloc *local_40;
  void *local_38;
  
  local_178.write_.shared_alloc_.alloc = (densities->write_).shared_alloc_.alloc;
  if (((ulong)local_178.write_.shared_alloc_.alloc & 7) == 0 &&
      local_178.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_178.write_.shared_alloc_.alloc =
           (Alloc *)((local_178.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_178.write_.shared_alloc_.alloc)->use_count =
           (local_178.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_178.write_.shared_alloc_.direct_ptr = (densities->write_).shared_alloc_.direct_ptr;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
  deep_copy<double>((Omega_h *)&local_1a0,&local_178,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,(ulong)(local_158.field_2._M_allocated_capacity + 1))
    ;
  }
  pAVar10 = local_178.write_.shared_alloc_.alloc;
  if (((ulong)local_178.write_.shared_alloc_.alloc & 7) == 0 &&
      local_178.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_178.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_178.write_.shared_alloc_.alloc);
      operator_delete(pAVar10,0x48);
    }
  }
  pvVar16 = local_198;
  uVar3 = mesh->dim_;
  if (3 < uVar3) {
    fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
         ,0x33);
  }
  local_88 = (cell_sizes->write_).shared_alloc_.alloc;
  if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88 = (Alloc *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)&local_88->size)->_M_allocated_capacity * 8 + 1);
    }
    else {
      local_88->use_count = local_88->use_count + 1;
    }
  }
  pAVar10 = local_88;
  pvVar6 = (cell_sizes->write_).shared_alloc_.direct_ptr;
  local_78 = (g->a2ab).write_.shared_alloc_.alloc;
  if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_78 = (Alloc *)(local_78->size * 8 + 1);
    }
    else {
      local_78->use_count = local_78->use_count + 1;
    }
  }
  iVar14 = uVar3 + 1;
  pvVar7 = (g->a2ab).write_.shared_alloc_.direct_ptr;
  local_68 = (g->ab2b).write_.shared_alloc_.alloc;
  if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_68 = (Alloc *)(local_68->size * 8 + 1);
    }
    else {
      local_68->use_count = local_68->use_count + 1;
    }
  }
  pvVar8 = (g->ab2b).write_.shared_alloc_.direct_ptr;
  local_50 = (densities->write_).shared_alloc_.alloc;
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_50 = (Alloc *)(local_50->size * 8 + 1);
    }
    else {
      local_50->use_count = local_50->use_count + 1;
    }
  }
  pvVar9 = (densities->write_).shared_alloc_.direct_ptr;
  local_40 = local_1a0;
  if (((ulong)local_1a0 & 7) == 0 && local_1a0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_40 = (Alloc *)(local_1a0->size * 8 + 1);
    }
    else {
      local_1a0->use_count = local_1a0->use_count + 1;
    }
  }
  pAVar11 = local_40;
  local_38 = local_198;
  local_190 = local_50;
  local_188 = local_68;
  local_180 = local_78;
  local_100 = (Mesh *)this;
  local_80 = pvVar6;
  local_70 = pvVar7;
  local_60 = pvVar8;
  local_58 = iVar14;
  local_48 = pvVar9;
  LVar12 = Mesh::nelems(mesh);
  local_e8 = pAVar10;
  if (((ulong)pAVar10 & 7) == 0 && pAVar10 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e8 = (Alloc *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)&pAVar10->size)->_M_allocated_capacity * 8 + 1);
    }
    else {
      pAVar10->use_count = pAVar10->use_count + 1;
    }
  }
  local_d8 = local_180;
  if (((ulong)local_180 & 7) == 0 && local_180 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d8 = (Alloc *)(local_180->size * 8 + 1);
    }
    else {
      local_180->use_count = local_180->use_count + 1;
    }
  }
  local_c8 = local_188;
  if (((ulong)local_188 & 7) == 0 && local_188 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8 = (Alloc *)(local_188->size * 8 + 1);
    }
    else {
      local_188->use_count = local_188->use_count + 1;
    }
  }
  local_b0 = local_190;
  if (((ulong)local_190 & 7) == 0 && local_190 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0 = (Alloc *)(local_190->size * 8 + 1);
    }
    else {
      local_190->use_count = local_190->use_count + 1;
    }
  }
  local_a0 = pAVar11;
  if (((ulong)pAVar11 & 7) == 0 && pAVar11 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0 = (Alloc *)(pAVar11->size * 8 + 1);
    }
    else {
      pAVar11->use_count = pAVar11->use_count + 1;
    }
  }
  pvStack_98 = pvVar16;
  pvStack_e0 = pvVar6;
  pvStack_d0 = pvVar7;
  pvStack_c0 = pvVar8;
  local_b8 = iVar14;
  pvStack_a8 = pvVar9;
  if (0 < LVar12) {
    local_158._M_dataplus._M_p = (pointer)local_e8;
    if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
      local_e8->use_count = local_e8->use_count + -1;
      local_158._M_dataplus._M_p =
           (pointer)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&local_e8->size)->_M_allocated_capacity * 8 + 1);
    }
    local_e8 = (Alloc *)0x0;
    pvStack_e0 = (void *)0x0;
    local_158.field_2._M_allocated_capacity = (size_type)local_d8;
    if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
      local_d8->use_count = local_d8->use_count + -1;
      local_158.field_2._M_allocated_capacity = local_d8->size * 8 + 1;
    }
    local_d8 = (Alloc *)0x0;
    pvStack_d0 = (void *)0x0;
    local_138 = local_c8;
    if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
      local_c8->use_count = local_c8->use_count + -1;
      local_138 = (Alloc *)(local_c8->size * 8 + 1);
    }
    local_c8 = (Alloc *)0x0;
    pvStack_c0 = (void *)0x0;
    local_120 = local_b0;
    if (((ulong)local_b0 & 7) == 0 && local_b0 != (Alloc *)0x0) {
      local_b0->use_count = local_b0->use_count + -1;
      local_120 = (Alloc *)(local_b0->size * 8 + 1);
    }
    local_b0 = (Alloc *)0x0;
    pvStack_a8 = (void *)0x0;
    local_108 = pvVar16;
    local_110 = local_a0;
    if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
      local_a0->use_count = local_a0->use_count + -1;
      local_110 = (Alloc *)(local_a0->size * 8 + 1);
    }
    local_a0 = (Alloc *)0x0;
    pvStack_98 = (void *)0x0;
    entering_parallel = '\0';
    lVar13 = 0;
    do {
      iVar4 = *(int *)((long)pvVar7 + lVar13 * 4);
      lVar15 = (long)iVar4;
      iVar5 = *(int *)((long)pvVar7 + lVar13 * 4 + 4);
      if (iVar4 < iVar5) {
        dVar2 = *(double *)((long)pvVar6 + lVar13 * 8);
        dVar18 = *(double *)((long)pvVar16 + lVar13 * 8);
        do {
          lVar17 = (long)*(int *)((long)pvVar8 + lVar15 * 4);
          dVar19 = *(double *)((long)pvVar6 + lVar17 * 8);
          if (dVar2 <= dVar19) {
            dVar19 = dVar2;
          }
          dVar18 = dVar18 + (*(double *)((long)pvVar9 + lVar17 * 8) -
                            *(double *)((long)pvVar9 + lVar13 * 8)) *
                            (dVar19 / (dVar2 * (double)iVar14));
          *(double *)((long)pvVar16 + lVar13 * 8) = dVar18;
          lVar15 = lVar15 + 1;
        } while (iVar5 != lVar15);
      }
      lVar13 = lVar13 + 1;
    } while (LVar12 != (int)lVar13);
    local_158._M_string_length = (size_type)pvVar6;
    local_158.field_2._8_8_ = pvVar7;
    local_130 = pvVar8;
    local_128 = iVar14;
    local_118 = pvVar9;
    diffuse_densities_once(Omega_h::Mesh*,Omega_h::Graph,Omega_h::Read<double>,Omega_h::Read<double>)
    ::$_0::~__0((__0 *)&local_158);
  }
  diffuse_densities_once(Omega_h::Mesh*,Omega_h::Graph,Omega_h::Read<double>,Omega_h::Read<double>)
  ::$_0::~__0((__0 *)&local_e8);
  this_00 = local_100;
  uVar3 = mesh->dim_;
  if (3 < uVar3) {
    fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
         ,0x33);
  }
  local_168.shared_alloc_.alloc = local_1a0;
  if (((ulong)local_1a0 & 7) == 0 && local_1a0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_168.shared_alloc_.alloc = (Alloc *)(local_1a0->size * 8 + 1);
    }
    else {
      local_1a0->use_count = local_1a0->use_count + 1;
    }
  }
  local_168.shared_alloc_.direct_ptr = local_198;
  Read<double>::Read(&local_f8,&local_168);
  Mesh::sync_array<double>(this_00,(Int)mesh,(Read<double> *)(ulong)uVar3,(Int)&local_f8);
  if (((ulong)local_f8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_f8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_f8.write_.shared_alloc_.alloc);
      operator_delete(local_f8.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar10 = local_168.shared_alloc_.alloc;
  if (((ulong)local_168.shared_alloc_.alloc & 7) == 0 &&
      local_168.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_168.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_168.shared_alloc_.alloc);
      operator_delete(pAVar10,0x48);
    }
  }
  diffuse_densities_once(Omega_h::Mesh*,Omega_h::Graph,Omega_h::Read<double>,Omega_h::Read<double>)
  ::$_0::~__0((__0 *)&local_88);
  pvVar16 = extraout_RDX;
  if (((ulong)local_1a0 & 7) == 0 && local_1a0 != (Alloc *)0x0) {
    piVar1 = &local_1a0->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1a0);
      operator_delete(local_1a0,0x48);
      pvVar16 = extraout_RDX_00;
    }
  }
  RVar20.write_.shared_alloc_.direct_ptr = pvVar16;
  RVar20.write_.shared_alloc_.alloc = (Alloc *)this_00;
  return (Reals)RVar20.write_.shared_alloc_;
}

Assistant:

Reals diffuse_densities_once(
    Mesh* mesh, Graph g, Reals densities, Reals cell_sizes) {
  auto out = deep_copy(densities);
  auto max_deg = mesh->dim() + 1;
  auto f = OMEGA_H_LAMBDA(LO e) {
    auto s = cell_sizes[e];
    for (auto ee = g.a2ab[e]; ee < g.a2ab[e + 1]; ++ee) {
      auto oe = g.ab2b[ee];
      auto os = cell_sizes[oe];
      auto mins = min2(s, os);  // minimum of this and other cell size
      /* get difference in densities, multiply by (mins / max_deg)
         to get a mass value that is below the stable limit,
         then divide that mass value by (s) to get the density
         delta to add to this density */
      auto factor = mins / (s * max_deg);
      auto x = densities[e];
      auto ox = densities[oe];
      out[e] += (ox - x) * factor;
    }
  };
  parallel_for(mesh->nelems(), f, "diffuse_densities");
  return mesh->sync_array(mesh->dim(), Reals(out), 1);
}